

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall xLearn::Trainer::show_head_info(Trainer *this,bool validate)

{
  ostream *os;
  ostream *mod;
  byte in_SIL;
  vector<int,_std::allocator<int>_> *in_RDI;
  Modifier reset;
  Modifier green;
  vector<int,_std::allocator<int>_> width_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  value_type *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator *paVar1;
  Modifier local_180;
  Modifier local_17c;
  undefined4 local_178;
  allocator local_171;
  string local_170 [36];
  undefined4 local_14c;
  string local_148 [32];
  string local_128 [36];
  undefined4 local_104;
  string local_100 [32];
  string local_e0 [36];
  undefined4 local_bc;
  string local_b8 [16];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  string local_98 [32];
  undefined4 local_78;
  allocator local_61;
  string local_60 [87];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b52b5);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b52c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Epoch",&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_78 = 6;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
             (value_type_conflict1 *)in_stack_fffffffffffffe58);
  (**(code **)(*(long *)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x40))(local_b8);
  std::operator+(in_stack_fffffffffffffe68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  local_bc = 0x14;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
             (value_type_conflict1 *)in_stack_fffffffffffffe58);
  if ((local_9 & 1) != 0) {
    (**(code **)(*(long *)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x40))(local_100);
    std::operator+(in_stack_fffffffffffffe68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    local_104 = 0x14;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
               (value_type_conflict1 *)in_stack_fffffffffffffe58);
    if (in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      (**(code **)(*(long *)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 0x28))(local_148);
      std::operator+(in_stack_fffffffffffffe68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      local_14c = 0x14;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                 (value_type_conflict1 *)in_stack_fffffffffffffe58);
    }
  }
  paVar1 = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"Time cost (sec)",paVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_178 = 0x14;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
             (value_type_conflict1 *)in_stack_fffffffffffffe58);
  Color::Modifier::Modifier(&local_17c,FG_GREEN);
  Color::Modifier::Modifier(&local_180,RESET);
  os = Color::operator<<(in_stack_fffffffffffffe60,(Modifier *)in_stack_fffffffffffffe58);
  mod = std::operator<<(os,"[------------]");
  Color::operator<<(os,(Modifier *)mod);
  Color::print_row<std::__cxx11::string>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  return;
}

Assistant:

void Trainer::show_head_info(bool validate) {
  std::vector<std::string> str_list;
  std::vector<int> width_list;
  str_list.push_back("Epoch");
  width_list.push_back(6);
  str_list.push_back("Train " + loss_->loss_type());
  width_list.push_back(20);
  if (validate) {
    str_list.push_back("Test " + loss_->loss_type());
    width_list.push_back(20);
    if (metric_ != nullptr) {
      str_list.push_back("Test " + metric_->metric_type());
      width_list.push_back(20);
    }
  }
  str_list.push_back("Time cost (sec)");
  width_list.push_back(20);
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier reset(Color::RESET);
  std::cout << green << "[------------]" << reset;
  Color::print_row(str_list, width_list);
}